

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O0

econf_err setKey(econf_file *key_file,size_t num,char *value)

{
  char *pcVar1;
  char *value_local;
  size_t num_local;
  econf_file *key_file_local;
  
  if ((key_file == (econf_file *)0x0) || (value == (char *)0x0)) {
    key_file_local._4_4_ = ECONF_ERROR;
  }
  else {
    if (key_file->file_entry[num].key != (char *)0x0) {
      free(key_file->file_entry[num].key);
    }
    pcVar1 = strdup(value);
    key_file->file_entry[num].key = pcVar1;
    if (key_file->file_entry[num].key == (char *)0x0) {
      key_file_local._4_4_ = ECONF_NOMEM;
    }
    else {
      key_file_local._4_4_ = ECONF_SUCCESS;
    }
  }
  return key_file_local._4_4_;
}

Assistant:

econf_err setKey(econf_file *key_file, size_t num, const char *value) {
  if (key_file == NULL || value == NULL)
    return ECONF_ERROR;
  if (key_file->file_entry[num].key)
    free(key_file->file_entry[num].key);
  key_file->file_entry[num].key = strdup(value);
  if (key_file->file_entry[num].key == NULL)
    return ECONF_NOMEM;

  return ECONF_SUCCESS;
}